

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsp.hh
# Opt level: O1

PathResult
wsp(Position *start,function<bool_(Position)> *reached_end,State *state,
   function<int_(Position)> *cell_cost)

{
  ulong *puVar1;
  char cVar2;
  int iVar3;
  _Bit_type *p_Var4;
  ulong uVar5;
  pointer piVar6;
  bool bVar7;
  int iVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  Direction unaff_R14;
  PathResult PVar16;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  C;
  allocator_type local_ca;
  allocator_type local_c9;
  vector<int,_std::allocator<int>_> local_c8;
  Position *local_a8;
  char *local_a0;
  priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_albertsgrc[P]q_mspacman_src_agents_pacman_______pathfinding_wsp_hh:24:17)>
  local_98;
  char *local_70;
  _Any_data *local_68;
  ulong local_60;
  _Any_data *local_58;
  Direction local_50;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
  super__Vector_impl_data._M_start = *(pointer *)start;
  local_a8 = start;
  local_68 = (_Any_data *)cell_cost;
  if ((reached_end->super__Function_base)._M_manager != (_Manager_type)0x0) {
    bVar7 = (*reached_end->_M_invoker)((_Any_data *)reached_end,(Position *)&local_98);
    if (bVar7) {
      uVar13 = 1;
      unaff_R14 = Direction::STAY;
    }
    else {
      local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      SeenMatrix::reset();
      iVar8 = (state->maze).r;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_c8,(long)(state->maze).c,&MAXINT,&local_c9);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_48,(long)iVar8,&local_c8,&local_ca);
      local_58 = (_Any_data *)reached_end;
      if ((Position)
          local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (Position)0x0) {
        operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar8 = local_a8->i;
      uVar10 = (ulong)local_a8->j;
      uVar13 = uVar10 + 0x3f;
      if (-1 < (long)uVar10) {
        uVar13 = uVar10;
      }
      puVar1 = SeenMatrix::S.
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar8].
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base._M_p +
               ((long)uVar13 >> 6) +
               (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
      *puVar1 = *puVar1 | 1L << ((byte)local_a8->j & 0x3f);
      iVar8 = PathMagic::index_from_pos.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar8].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [uVar10];
      pcVar11 = PathMagic::valid_dirs.
                super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar8].
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_start;
      local_70 = PathMagic::valid_dirs.
                 super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar8].
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
      if (pcVar11 != local_70) {
        unaff_R14 = (Direction)&local_c8;
        do {
          cVar2 = *pcVar11;
          uVar13 = (long)Direction::LIST[cVar2].i + (long)local_a8->i;
          lVar14 = (long)Direction::LIST[cVar2].j + (long)local_a8->j;
          local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)((lVar14 << 0x20) + (uVar13 & 0xffffffff));
          local_a0 = pcVar11;
          if (*(long *)(local_68 + 1) == 0) goto LAB_00106fc6;
          iVar8 = (**(code **)(local_68->_M_pod_data + 0x18))(local_68,(Position *)unaff_R14);
          local_48.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar13].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [lVar14] = iVar8;
          local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ =
               local_48.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar14];
          local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)(lVar14 << 0x20 | uVar13 & 0xffffffff);
          local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = *(pointer *)(Direction::LIST + cVar2);
          std::
          priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/../../pathfinding/wsp.hh:24:17)>
          ::push(&local_98,(value_type *)unaff_R14);
          pcVar11 = local_a0 + 1;
        } while (pcVar11 != local_70);
      }
      if (local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_60 = 0x800000000000003f;
        do {
          local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)
                      local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          if (*(long *)(local_58 + 1) == 0) goto LAB_00106fcb;
          bVar7 = (**(code **)(local_58->_M_pod_data + 0x18))(local_58,(Position *)&local_c8);
          if (bVar7) break;
          iVar8 = *(int *)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          iVar3 = *(int *)((long)local_98.c.
                                 super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 4);
          local_50 = *(Direction *)
                      ((long)local_98.c.
                             super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl
                             .super__Vector_impl_data._M_start + 8);
          if (0x14 < (long)local_98.c.
                           super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_98.c.
                           super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
                           super__Vector_impl_data._M_start) {
            local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._0_4_ =
                 *(int *)((long)local_98.c.
                                super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                                _M_impl.super__Vector_impl_data._M_finish + -4);
            local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = *(pointer *)
                        ((long)local_98.c.
                               super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x14);
            local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = *(pointer *)
                         ((long)local_98.c.
                                super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                                _M_impl.super__Vector_impl_data._M_finish + -0xc);
            *(int *)((long)local_98.c.
                           super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
                           super__Vector_impl_data._M_finish + -0x14) = iVar8;
            *(int *)((long)local_98.c.
                           super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
                           super__Vector_impl_data._M_finish + -0x10) = iVar3;
            *(undefined4 *)
             ((long)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                    _M_impl.super__Vector_impl_data._M_finish + -0xc) =
                 *(undefined4 *)
                  ((long)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                         _M_impl.super__Vector_impl_data._M_start + 8);
            *(undefined4 *)
             ((long)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                    _M_impl.super__Vector_impl_data._M_finish + -8) =
                 *(undefined4 *)
                  ((long)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                         _M_impl.super__Vector_impl_data._M_start + 0xc);
            *(undefined4 *)
             ((long)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                    _M_impl.super__Vector_impl_data._M_finish + -4) =
                 *(undefined4 *)
                  ((long)local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                         _M_impl.super__Vector_impl_data._M_start + 0x10);
            std::
            __adjust_heap<__gnu_cxx::__normal_iterator<CostPathStep*,std::vector<CostPathStep,std::allocator<CostPathStep>>>,long,CostPathStep,__gnu_cxx::__ops::_Iter_comp_iter<wsp(Position_const&,std::function<bool(Position)>,State_const&,std::function<int(Position)>)::__0>>
                      (local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                       _M_impl.super__Vector_impl_data._M_start,0,
                       (((long)local_98.c.
                               super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x14) -
                        (long)local_98.c.
                              super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333);
          }
          local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((long)local_98.c.
                               super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x14);
          local_a0 = (char *)(long)iVar8;
          uVar10 = (ulong)iVar3;
          uVar13 = uVar10 + 0x3f;
          if (-1 < (long)uVar10) {
            uVar13 = uVar10;
          }
          p_Var4 = SeenMatrix::S.
                   super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)local_a0].
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base._M_p;
          uVar12 = (ulong)((uVar10 & local_60) < 0x8000000000000001);
          uVar5 = p_Var4[((long)uVar13 >> 6) + uVar12 + 0xffffffffffffffff];
          if ((uVar5 >> (uVar10 & 0x3f) & 1) == 0) {
            p_Var4[((long)uVar13 >> 6) + uVar12 + 0xffffffffffffffff] =
                 uVar5 | 1L << ((byte)iVar3 & 0x3f);
            local_a8 = (Position *)((long)local_a0 * 3);
            iVar8 = PathMagic::index_from_pos.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)local_a0].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[uVar10];
            pcVar11 = PathMagic::valid_dirs.
                      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar8].
                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_70 = PathMagic::valid_dirs.
                       super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar8].
                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            if (pcVar11 != local_70) {
              do {
                pcVar15 = local_a0 + Direction::LIST[*pcVar11].i;
                unaff_R14 = (Direction)((long)Direction::LIST[*pcVar11].j + uVar10);
                local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)(((ulong)pcVar15 & 0xffffffff) + ((long)unaff_R14 << 0x20));
                if (*(long *)(local_68 + 1) == 0) {
                  std::__throw_bad_function_call();
                  goto LAB_00106fc6;
                }
                iVar8 = (**(code **)(local_68->_M_pod_data + 0x18))(local_68,(Position *)&local_c8);
                iVar8 = iVar8 + (&((local_48.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start)[(long)local_a8][uVar10] + 1;
                piVar6 = local_48.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)pcVar15].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (iVar8 < piVar6[(long)unaff_R14]) {
                  piVar6[(long)unaff_R14] = iVar8;
                  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._0_4_ =
                       local_48.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pcVar15].
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[(long)unaff_R14];
                  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)((long)unaff_R14 << 0x20 | (ulong)pcVar15 & 0xffffffff);
                  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)local_50;
                  std::
                  priority_queue<CostPathStep,_std::vector<CostPathStep,_std::allocator<CostPathStep>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/../../pathfinding/wsp.hh:24:17)>
                  ::push(&local_98,(value_type *)&local_c8);
                }
                pcVar11 = pcVar11 + 1;
              } while (pcVar11 != local_70);
            }
          }
        } while (local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
                 super__Vector_impl_data._M_start !=
                 local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if (local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        unaff_R14 = *(Direction *)
                     ((long)local_98.c.
                            super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
                            super__Vector_impl_data._M_start + 8);
      }
      uVar13 = (ulong)(local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                       _M_impl.super__Vector_impl_data._M_start !=
                      local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_48);
      if ((Position)
          local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
          super__Vector_impl_data._M_start != (Position)0x0) {
        operator_delete(local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    PVar16.found = (bool)(char)uVar13;
    PVar16._9_3_ = (int3)(uVar13 >> 8);
    PVar16.dist = (int)(uVar13 >> 0x20);
    PVar16.dir = unaff_R14;
    return PVar16;
  }
LAB_00106fd0:
  uVar9 = std::__throw_bad_function_call();
  if ((Position)
      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (Position)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((Position)
      local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>._M_impl.
      super__Vector_impl_data._M_start != (Position)0x0) {
    operator_delete(local_98.c.super__Vector_base<CostPathStep,_std::allocator<CostPathStep>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar9);
LAB_00106fc6:
  std::__throw_bad_function_call();
LAB_00106fcb:
  std::__throw_bad_function_call();
  goto LAB_00106fd0;
}

Assistant:

PathResult wsp(const Position& start,
                          function<bool(Position)> reached_end,
                          const State& state,
                          function<int(Position)> cell_cost) {

    if (reached_end(start)) return PathResult(Direction::STAY, 0);

    auto comp = [](const CostPathStep& a, const CostPathStep& b) {
        return a.cost > b.cost;
    };

    priority_queue<CostPathStep, vector<CostPathStep>, decltype(comp)> Q(comp);
    SeenMatrix::reset();
    vector<vector<bool>>& S = SeenMatrix::S;
    vector<vector<int>> C(state.maze.rows(), vector<int>(state.maze.cols(), MAXINT));

    S[start.i][start.j] = true;

    for (char d : PathMagic::dirs(start)) {
        const Direction& dir = Direction::LIST[(int)d];
        Position s = start.move_destination(dir);

        C[s.i][s.j] = cell_cost(s);
        Q.push(CostPathStep(s, dir, C[s.i][s.j]));
    }

    while (not Q.empty() and not reached_end(Q.top().pos)) {
        CostPathStep a = Q.top(); Q.pop();
        if (not S[a.pos.i][a.pos.j]) {
            S[a.pos.i][a.pos.j] = true;
            for (char d : PathMagic::dirs(a.pos)) {
                const Direction& dir = Direction::LIST[(int)d];
                Position s = a.pos.move_destination(dir);
                int c = cell_cost(s) + 1;
                if (C[a.pos.i][a.pos.j] + c < C[s.i][s.j]) {
                    C[s.i][s.j] = C[a.pos.i][a.pos.j] + c;
                    Q.push(CostPathStep(s, a.initial, C[s.i][s.j]));
    }   }   }   }

    return Q.empty() ? PathResult(false) : PathResult(Q.top().initial, 0);
}